

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O1

Gia_Obj_t * Gia_ObjRoToRi(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  uint uVar2;
  
  if (((~(uint)*(undefined8 *)pObj & 0x9fffffff) != 0) ||
     (uVar2 = (uint)((ulong)*(undefined8 *)pObj >> 0x20),
     (int)(uVar2 & 0x1fffffff) < p->vCis->nSize - p->nRegs)) {
    __assert_fail("Gia_ObjIsRo(p, pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1fd,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
  }
  iVar1 = p->vCos->nSize;
  uVar2 = (uVar2 & 0x1fffffff) + (iVar1 - p->vCis->nSize);
  if ((-1 < (int)uVar2) && ((int)uVar2 < iVar1)) {
    iVar1 = p->vCos->pArray[uVar2];
    if ((-1 < (long)iVar1) && (iVar1 < p->nObjs)) {
      return p->pObjs + iVar1;
    }
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

static inline Gia_Obj_t *  Gia_ObjRoToRi( Gia_Man_t * p, Gia_Obj_t * pObj )    { assert( Gia_ObjIsRo(p, pObj) ); return Gia_ManCo(p, Gia_ManCoNum(p) - Gia_ManCiNum(p) + Gia_ObjCioId(pObj)); }